

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::ExpandListArgument
               (string *arg,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *newargs,bool emptyArgs)

{
  char cVar1;
  long lVar2;
  undefined7 in_register_00000011;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  string newArg;
  
  if (((int)CONCAT71(in_register_00000011,emptyArgs) == 0) && (arg->_M_string_length == 0)) {
    return;
  }
  iVar4 = 0;
  lVar2 = std::__cxx11::string::find((char)arg,0x3b);
  if (lVar2 == -1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(newargs,arg);
    return;
  }
  newArg._M_dataplus._M_p = (pointer)&newArg.field_2;
  newArg._M_string_length = 0;
  newArg.field_2._M_local_buf[0] = '\0';
  pcVar3 = (arg->_M_dataplus)._M_p;
  pcVar5 = pcVar3;
  do {
    cVar1 = *pcVar3;
    if (cVar1 == ';') {
      if (iVar4 == 0) {
        std::__cxx11::string::append((char *)&newArg,(ulong)pcVar5);
        pcVar5 = pcVar3 + 1;
        iVar4 = 0;
        if (newArg._M_string_length != 0 || emptyArgs) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(newargs,&newArg);
          std::__cxx11::string::assign((char *)&newArg);
        }
      }
    }
    else if (cVar1 == '[') {
      iVar4 = iVar4 + 1;
    }
    else if (cVar1 == '\\') {
      if (pcVar3[1] == ';') {
        std::__cxx11::string::append((char *)&newArg,(ulong)pcVar5);
        pcVar3 = pcVar3 + 1;
        pcVar5 = pcVar3;
      }
    }
    else if (cVar1 == ']') {
      iVar4 = iVar4 + -1;
    }
    else if (cVar1 == '\0') {
      std::__cxx11::string::append((char *)&newArg);
      if (newArg._M_string_length != 0 || emptyArgs) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(newargs,&newArg);
      }
      std::__cxx11::string::~string((string *)&newArg);
      return;
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

void cmSystemTools::ExpandListArgument(const std::string& arg,
                                       std::vector<std::string>& newargs,
                                       bool emptyArgs)
{
  // If argument is empty, it is an empty list.
  if (!emptyArgs && arg.empty()) {
    return;
  }
  // if there are no ; in the name then just copy the current string
  if (arg.find(';') == std::string::npos) {
    newargs.push_back(arg);
    return;
  }
  std::string newArg;
  const char* last = arg.c_str();
  // Break the string at non-escaped semicolons not nested in [].
  int squareNesting = 0;
  for (const char* c = last; *c; ++c) {
    switch (*c) {
      case '\\': {
        // We only want to allow escaping of semicolons.  Other
        // escapes should not be processed here.
        const char* next = c + 1;
        if (*next == ';') {
          newArg.append(last, c - last);
          // Skip over the escape character
          last = c = next;
        }
      } break;
      case '[': {
        ++squareNesting;
      } break;
      case ']': {
        --squareNesting;
      } break;
      case ';': {
        // Break the string here if we are not nested inside square
        // brackets.
        if (squareNesting == 0) {
          newArg.append(last, c - last);
          // Skip over the semicolon
          last = c + 1;
          if (!newArg.empty() || emptyArgs) {
            // Add the last argument if the string is not empty.
            newargs.push_back(newArg);
            newArg = "";
          }
        }
      } break;
      default: {
        // Just append this character.
      } break;
    }
  }
  newArg.append(last);
  if (!newArg.empty() || emptyArgs) {
    // Add the last argument if the string is not empty.
    newargs.push_back(newArg);
  }
}